

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_mkdir(char *dir,int create_parents)

{
  int iVar1;
  int iVar2;
  size_t __n;
  pointer pcVar3;
  type pcVar4;
  unique_ptr<char[],_std::default_delete<char[]>_> *this;
  char *pcVar5;
  int in_ESI;
  char *in_RDI;
  char par [4096];
  __array tmp;
  size_t len;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  size_t in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (*in_RDI == '\0') {
    return 1;
  }
  __n = strlen(in_RDI);
  std::make_unique<char[]>(in_stack_ffffffffffffefc8);
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffefb0);
  strncpy(pcVar3,in_RDI,__n);
  while (pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                            (in_stack_ffffffffffffefb0,
                             CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8)),
        *pcVar4 == '/') {
    __n = __n - 1;
  }
  this = (unique_ptr<char[],_std::default_delete<char[]>_> *)
         std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                   (in_stack_ffffffffffffefb0,
                    CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
  iVar2 = (int)(__n >> 0x20);
  *(undefined1 *)
   &(this->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = 0;
  if (in_ESI != 0) {
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
    pcVar5 = strchr(pcVar3,0x2f);
    if (pcVar5 != (char *)0x0) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
      os_get_path_name(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0
                      );
      iVar1 = access(&stack0xffffffffffffefc8,0);
      if ((iVar1 != 0) &&
         (iVar2 = os_mkdir((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),iVar2), iVar2 == 0)) {
        local_4 = 0;
        goto LAB_001fbabe;
      }
    }
  }
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
  iVar2 = mkdir(pcVar3,0x1ff);
  local_4 = (uint)(iVar2 == 0);
LAB_001fbabe:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this);
  return local_4;
}

Assistant:

int
os_mkdir( const char* dir, int create_parents )
{
    //assert(dir != 0);

    if (dir[0] == '\0')
        return true;

    // Copy the directory name to a new string so we can strip any trailing
    // path seperators.
    size_t len = strlen(dir);
    const auto tmp = std::make_unique<char[]>(len + 1);
    strncpy(tmp.get(), dir, len);
    while (tmp[len - 1] == OSPATHCHAR)
        --len;
    tmp[len] = '\0';

    // If we're creating intermediate diretories, and the path contains
    // multiple elements, recursively create the parent directories first.
    if (create_parents and strchr(tmp.get(), OSPATHCHAR) != 0) {
        char par[OSFNMAX];

        // Extract the parent path.
        os_get_path_name(par, sizeof(par), tmp.get());

        // If the parent doesn't already exist, create it recursively.
        if (osfacc(par) != 0 and not os_mkdir(par, true)) {
            return false;
        }
    }

    // Create the directory.
#if HAVE_MKDIR
    return mkdir(tmp.get(), S_IRWXU | S_IRWXG | S_IRWXO) == 0;
#elif HAVE_UNDERSCORE_MKDIR
    return _mkdir(tmp.get()) == 0;
#else
#   error "Neither mkdir() nor _mkdir() is available on this system."
#endif
}